

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

cf_errno_t cf_que_enqueue(cf_que_t *que,cf_void_t *data,cf_size_t size)

{
  cf_size_t size_local;
  cf_void_t *data_local;
  cf_que_t *que_local;
  
  if (((que == (cf_que_t *)0x0) || (data == (cf_void_t *)0x0)) || (size == 0)) {
    que_local._4_4_ = 2;
  }
  else if ((que->empty == 0) && (que->tail == que->head)) {
    que_local._4_4_ = 5;
  }
  else {
    que->items[que->tail].size = size;
    que->items[que->tail].data = data;
    que->tail = (cf_uint_t)((ulong)(que->tail + 1) % que->max_size);
    if (que->empty == 1) {
      que->empty = 0;
    }
    que_local._4_4_ = 0;
  }
  return que_local._4_4_;
}

Assistant:

cf_errno_t  cf_que_enqueue(cf_que_t* que, cf_void_t* data, cf_size_t size) {
    if(!que || !data || size == 0) return CF_EPARAM;
    /* full */
    if(que->empty == CF_FALSE && que->tail == que->head) return CF_EFULL;

    que->items[que->tail].size = size;
    que->items[que->tail].data = data;

    que->tail = (que->tail + 1) % que->max_size;

    if(que->empty == CF_TRUE) que->empty = CF_FALSE;
    return CF_OK;
}